

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

void __thiscall
smf::MidiFile::setPitchBendRange(MidiFile *this,int aTrack,int aTick,int aChannel,double range)

{
  ostream *poVar1;
  double dVar2;
  
  dVar2 = -range;
  if (-range <= range) {
    dVar2 = range;
  }
  if (24.0 < dVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Warning: pitch bend range is too large: ",0x28);
    poVar1 = std::ostream::_M_insert<double>(dVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Setting to 24.",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    dVar2 = 24.0;
  }
  addController(this,aTrack,aTick,aChannel,0x65,0);
  addController(this,aTrack,aTick,aChannel,100,0);
  addController(this,aTrack,aTick,aChannel,6,(int)dVar2);
  addController(this,aTrack,aTick,aChannel,0x26,(int)((dVar2 - (double)(int)dVar2) * 100.0 + 0.5));
  return;
}

Assistant:

void MidiFile::setPitchBendRange(int aTrack, int aTick, int aChannel, double range) {
	if (range < 0.0) {
		range = -range;
	}
	if (range > 24.0) {
		std::cerr << "Warning: pitch bend range is too large: " << range << std::endl;
		std::cerr << "Setting to 24." << std::endl;
		range = 24.0;
	}
	int irange = int(range);
	int cents = int((range - irange) * 100.0 + 0.5);

	// Select pitch bend RPN:
	addController(aTrack, aTick, aChannel, 101, 0);  // RPN selector (byte 1)
	addController(aTrack, aTick, aChannel, 100, 0);  // RPN selector (byte 2)

	// Set the semitone range (will be +/-range above/below a note):
	addController(aTrack, aTick, aChannel,  6,  irange);  // coarse: number of semitones
	addController(aTrack, aTick, aChannel, 38,  cents);   // fine: cents (1/100ths of semitone)
}